

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O1

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty
               (BenchmarkContext *context)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  ulong count;
  ulong *puVar2;
  ulong uVar3;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  s;
  string local_58;
  StorageArray<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
  local_38;
  anon_class_8_1_54a39813 local_28;
  
  count = context->_iterationsCount;
  uVar3 = 0xffffffffffffffff;
  if (count * 8 < 0xfffffffffffffff8) {
    uVar3 = count * 8 + 8;
  }
  local_38._size = count;
  puVar2 = (ulong *)operator_new__(-(ulong)(count >> 0x3d != 0) | uVar3);
  *puVar2 = count;
  local_38._arr =
       (Storage<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
        *)(puVar2 + 1);
  paVar1 = &local_58.field_2;
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"create","");
  local_28.s = &local_38;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty(benchmarks::BenchmarkContext&)::_lambda()_1_>
            (context,&local_58,count,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"signal","");
  (*context->_vptr_BenchmarkContext[2])(context,&local_58,count);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  local_58._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_58,"destroy","");
  local_28.s = &local_38;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::CreateEmpty(benchmarks::BenchmarkContext&)::_lambda()_2_>
            (context,&local_58,count,&local_28);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != paVar1) {
    operator_delete(local_58._M_dataplus._M_p);
  }
  if (local_38._arr !=
      (Storage<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>
       *)0x0) {
    operator_delete__(local_38._arr + -1);
  }
  return;
}

Assistant:

static void CreateEmpty(BenchmarkContext& context)
        {
            const auto n = context.GetIterationsCount();

            StorageArray<SignalType> s(n);

            context.Profile("create", n, [&]{ s.Construct(); });
            context.MeasureMemory("signal", n);
            context.Profile("destroy", n, [&]{ s.Destruct(); });
        }